

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O0

void __thiscall
libguarded::detail::
deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
::operator()(deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
             *this,pointer p)

{
  pointer p_local;
  deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
  *this_local;
  
  if (p != (pointer)0x0) {
    std::
    allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>>
    ::
    destroy<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>
              ((allocator_type *)this,p);
    std::
    allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
    ::deallocate((allocator_type *)this,p,1);
  }
  return;
}

Assistant:

void operator()(pointer p) {
      if (p != nullptr) {
         allocator_traits::destroy(m_alloc, p);
         allocator_traits::deallocate(m_alloc, p, 1);
      }
   }